

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

uint Js::JavascriptOperators::GetLiteralInlineSlotCapacity(PropertyIdArray *propIds)

{
  bool bVar1;
  uint *puVar2;
  ushort local_1e;
  uint local_1c;
  PropertyIdArray *local_18;
  PropertyIdArray *propIds_local;
  
  if ((propIds->hadDuplicates & 1U) == 0) {
    local_18 = propIds;
    bVar1 = FunctionBody::DoObjectHeaderInliningForObjectLiteral(propIds);
    if (bVar1) {
      local_1e = DynamicTypeHandler::RoundUpObjectHeaderInlinedInlineSlotCapacity
                           ((PropertyIndex)local_18->count);
    }
    else {
      local_1c = 0x10;
      puVar2 = min<unsigned_int>(&local_18->count,&local_1c);
      local_1e = DynamicTypeHandler::RoundUpInlineSlotCapacity((PropertyIndex)*puVar2);
    }
    propIds_local._4_4_ = (uint)local_1e;
  }
  else {
    propIds_local._4_4_ = 0;
  }
  return propIds_local._4_4_;
}

Assistant:

uint JavascriptOperators::GetLiteralInlineSlotCapacity(
        Js::PropertyIdArray const * propIds)
    {
        if (propIds->hadDuplicates)
        {
            return 0;
        }

        return
            FunctionBody::DoObjectHeaderInliningForObjectLiteral(propIds)
                ?   DynamicTypeHandler::RoundUpObjectHeaderInlinedInlineSlotCapacity(static_cast<PropertyIndex>(propIds->count))
                :   DynamicTypeHandler::RoundUpInlineSlotCapacity(
                        static_cast<PropertyIndex>(
                            min(propIds->count, static_cast<uint32>(MaxPreInitializedObjectTypeInlineSlotCount))));
    }